

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::ListOp<unsigned_int>::ClearAndMakeExplicit(ListOp<unsigned_int> *this)

{
  ListOp<unsigned_int> *this_local;
  
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->explicit_items);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->added_items);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->prepended_items);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->appended_items);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->deleted_items);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->ordered_items);
  this->is_explicit = true;
  return;
}

Assistant:

void ClearAndMakeExplicit() {
    explicit_items.clear();
    added_items.clear();
    prepended_items.clear();
    appended_items.clear();
    deleted_items.clear();
    ordered_items.clear();

    is_explicit = true;
  }